

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<unsigned_long,long,StringLiteral>
               (ostream *out,char *fmt,unsigned_long *args,long *args_1,StringLiteral *args_2)

{
  FormatList local_58;
  FormatArg local_48;
  long *local_30;
  code *local_28;
  code *local_20;
  StringLiteral *local_18;
  code *local_10;
  code *local_8;
  
  local_58.m_formatters = &local_48;
  local_58.m_N = 3;
  local_48.m_formatImpl = detail::FormatArg::formatImpl<unsigned_long>;
  local_48.m_toIntImpl = detail::FormatArg::toIntImpl<unsigned_long>;
  local_28 = detail::FormatArg::formatImpl<long>;
  local_20 = detail::FormatArg::toIntImpl<long>;
  local_10 = detail::FormatArg::formatImpl<StringLiteral>;
  local_8 = detail::FormatArg::toIntImpl<StringLiteral>;
  local_48.m_value = args;
  local_30 = args_1;
  local_18 = args_2;
  vformat(out,fmt,&local_58);
  return;
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}